

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_partitioned_aggregate.cpp
# Opt level: O2

OperatorPartitionInfo * __thiscall
duckdb::PhysicalPartitionedAggregate::RequiredPartitionInfo
          (OperatorPartitionInfo *__return_storage_ptr__,PhysicalPartitionedAggregate *this)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_28;
  
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_28,
             &(this->partitions).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  OperatorPartitionInfo::PartitionColumns
            (__return_storage_ptr__,(vector<unsigned_long,_true> *)&_Stack_28);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

OperatorPartitionInfo PhysicalPartitionedAggregate::RequiredPartitionInfo() const {
	return OperatorPartitionInfo::PartitionColumns(partitions);
}